

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

bool __thiscall PDA::evaluate(PDA *this,string *s)

{
  char input;
  State *pSVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  PDA *this_00;
  size_type sVar5;
  initializer_list<EvaluationState> __l;
  allocator_type local_181;
  PDA *local_180;
  vector<EvaluationState,_std::allocator<EvaluationState>_> evaluations;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_150;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_138;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_120;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_108;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_f0;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  stack;
  EvaluationState local_88;
  
  evaluations.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  evaluations.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  evaluations.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&stack);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&stack.c,&this->startStackZ0);
  pSVar1 = this->startState;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_88,&stack.c);
  __l._M_len = 1;
  __l._M_array = &local_88;
  local_88.currentStates = pSVar1;
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector(&local_138,__l,&local_181);
  local_180 = this;
  eclose(&local_f0,this,&local_138);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::_M_move_assign
            (&evaluations,&local_f0);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_f0);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_138);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar3 = s->_M_string_length;
  for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
    input = pcVar2[sVar5];
    this_00 = (PDA *)&evaluations;
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector
              (&local_120,(vector<EvaluationState,_std::allocator<EvaluationState>_> *)this_00);
    nextEvaluations(&local_108,this_00,&local_120,input);
    eclose((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&local_88,local_180,
           &local_108);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::_M_move_assign
              (&evaluations,&local_88);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
              ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&local_88);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_108);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_120);
  }
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector(&local_150,&evaluations);
  bVar4 = containsEndState(local_180,&local_150);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_150);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&stack.c);
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&evaluations);
  return bVar4;
}

Assistant:

bool PDA::evaluate(std::string s) {

    std::vector<EvaluationState> evaluations;

    std::stack<std::string> stack;
    stack.push(startStackZ0);

    evaluations = eclose({EvaluationState(stack, startState)});

    for (char c: s) {
        evaluations = eclose(nextEvaluations(evaluations, c));
    }

    return containsEndState(evaluations);
}